

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O1

shared_ptr<chrono::ChLinkTSDA> __thiscall
chrono::viper::AddSuspensionSpring
          (viper *this,shared_ptr<chrono::ChBodyAuxRef> *body1,
          shared_ptr<chrono::ChBodyAuxRef> *body2,shared_ptr<chrono::viper::ViperChassis> *chassis,
          ChVector<double> *pos1,ChVector<double> *pos2)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *plVar4;
  ChLinkTSDA *pCVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ChLinkTSDA *__tmp;
  shared_ptr<chrono::ChLinkTSDA> sVar8;
  ChVector<double> p2;
  ChVector<double> p1;
  undefined1 local_e9;
  ChLinkTSDA *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  undefined8 local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  element_type *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  element_type *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  shared_ptr<chrono::viper::ViperChassis> *local_a0;
  shared_ptr<chrono::ChBodyAuxRef> *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  peVar1 = (chassis->super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (peVar1->super_ViperPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->super_ViperPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_a0 = chassis;
  local_98 = body2;
  lVar6 = (**(code **)(*(long *)peVar2 + 0x1f0))();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  ChTransform<double>::TransformLocalToParent
            (pos1,(ChVector<double> *)(lVar6 + 8),(ChMatrix33<double> *)(lVar6 + 0x40));
  ChTransform<double>::TransformLocalToParent
            (pos2,(ChVector<double> *)(lVar6 + 8),(ChMatrix33<double> *)(lVar6 + 0x40));
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_e8 = (ChLinkTSDA *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChLinkTSDA,std::allocator<chrono::ChLinkTSDA>>
            (a_Stack_e0,&local_e8,(allocator<chrono::ChLinkTSDA> *)&local_e9);
  _Var7._M_pi = a_Stack_e0[0]._M_pi;
  pCVar5 = local_e8;
  local_e8 = (ChLinkTSDA *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(ChLinkTSDA **)this = pCVar5;
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var7._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (a_Stack_e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_e0[0]._M_pi);
  }
  local_b0 = (body1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a8 = (body1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_a8->_M_use_count = local_a8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_a8->_M_use_count = local_a8->_M_use_count + 1;
    }
  }
  local_c0 = (local_98->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_b8 = (local_98->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_b8->_M_use_count = local_b8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_b8->_M_use_count = local_b8->_M_use_count + 1;
    }
  }
  local_48 = local_78;
  local_40 = local_70;
  uStack_38 = uStack_68;
  local_60 = local_90;
  local_58 = local_88;
  uStack_50 = uStack_80;
  chrono::ChLinkTSDA::Initialize(pCVar5,&local_b0,&local_c0,0);
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  lVar6 = *(long *)this;
  *(undefined8 *)(lVar6 + 0x140) = 0x41286a0000000000;
  *(undefined8 *)(lVar6 + 0x148) = 0x40c3880000000000;
  peVar1 = (local_a0->super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (peVar1->super_ViperPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->super_ViperPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  plVar4 = *(long **)(peVar2 + 0x38);
  local_d0 = *(undefined8 *)this;
  local_c8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_c8->_M_use_count = local_c8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_c8->_M_use_count = local_c8->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar4 + 0x138))(plVar4,&local_d0);
  _Var7._M_pi = extraout_RDX;
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    _Var7._M_pi = extraout_RDX_01;
  }
  sVar8.super___shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar8.super___shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkTSDA>)
         sVar8.super___shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkTSDA> AddSuspensionSpring(std::shared_ptr<ChBodyAuxRef> body1,
                                                std::shared_ptr<ChBodyAuxRef> body2,
                                                std::shared_ptr<ViperChassis> chassis,
                                                const ChVector<>& pos1,
                                                const ChVector<>& pos2) {
    const ChFrame<>& X_GP = chassis->GetBody()->GetFrame_REF_to_abs();
    auto p1 = X_GP.TransformPointLocalToParent(pos1);
    auto p2 = X_GP.TransformPointLocalToParent(pos2);

    std::shared_ptr<ChLinkTSDA> spring;
    spring = chrono_types::make_shared<ChLinkTSDA>();
    spring->Initialize(body1, body2, false, p1, p2);
    spring->SetSpringCoefficient(800000.0);
    spring->SetDampingCoefficient(10000.0);
    chassis->GetBody()->GetSystem()->AddLink(spring);
    return spring;
}